

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int iSplitByDep(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **iMatch,int *iGroup,int *iLastItem,
               int *oGroup)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int local_60;
  int encode;
  int factor;
  Vec_Int_t *sortedArray;
  Vec_Int_t *array;
  int numOfItemsAdded;
  int k;
  int j;
  int i;
  int *oGroup_local;
  int *iLastItem_local;
  int *iGroup_local;
  Vec_Int_t **iMatch_local;
  Vec_Int_t **iDep_local;
  Abc_Ntk_t *pNtk_local;
  
  array._0_4_ = 0;
  for (k = 0; k < *iLastItem; k = k + 1) {
    iVar2 = Vec_IntSize(iMatch[k]);
    if (iVar2 != 1) {
      iVar2 = Vec_IntSize(iMatch[k]);
      p = Vec_IntAlloc(iVar2);
      iVar2 = Vec_IntSize(iMatch[k]);
      p_00 = Vec_IntAlloc(iVar2);
      for (numOfItemsAdded = 0; iVar2 = Vec_IntSize(iMatch[k]), numOfItemsAdded < iVar2;
          numOfItemsAdded = numOfItemsAdded + 1) {
        local_60 = 0;
        array._4_4_ = 0;
        while( true ) {
          iVar2 = Vec_IntEntry(iMatch[k],numOfItemsAdded);
          iVar2 = Vec_IntSize(iDep[iVar2]);
          if (iVar2 <= array._4_4_) break;
          iVar2 = Vec_IntEntry(iMatch[k],numOfItemsAdded);
          iVar2 = Vec_IntEntry(iDep[iVar2],array._4_4_);
          local_60 = oGroup[iVar2] + local_60;
          array._4_4_ = array._4_4_ + 1;
        }
        Vec_IntPush(p,local_60);
        Vec_IntPushUniqueOrder(p_00,local_60);
      }
      while (iVar2 = Vec_IntSize(p_00), 1 < iVar2) {
        for (array._4_4_ = 0; iVar2 = Vec_IntSize(iMatch[k]), array._4_4_ < iVar2;
            array._4_4_ = array._4_4_ + 1) {
          iVar2 = Vec_IntEntry(p,array._4_4_);
          iVar3 = Vec_IntEntryLast(p_00);
          if (iVar2 == iVar3) {
            pVVar1 = iMatch[*iLastItem + (int)array];
            iVar2 = Vec_IntEntry(iMatch[k],array._4_4_);
            Vec_IntPush(pVVar1,iVar2);
            iVar2 = *iLastItem;
            iVar3 = Vec_IntEntry(iMatch[k],array._4_4_);
            iGroup[iVar3] = iVar2 + (int)array;
            pVVar1 = iMatch[k];
            iVar2 = Vec_IntEntry(iMatch[k],array._4_4_);
            Vec_IntRemove(pVVar1,iVar2);
            iVar2 = Vec_IntEntry(p,array._4_4_);
            Vec_IntRemove(p,iVar2);
            array._4_4_ = array._4_4_ + -1;
          }
        }
        array._0_4_ = (int)array + 1;
        Vec_IntPop(p_00);
      }
      Vec_IntFree(p);
      Vec_IntFree(p_00);
    }
  }
  *iLastItem = (int)array + *iLastItem;
  return (int)array;
}

Assistant:

int iSplitByDep(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** iMatch, int* iGroup, int* iLastItem, int* oGroup)
{
    int i, j, k;    
    int numOfItemsAdded = 0;
    Vec_Int_t * array, * sortedArray;    

    for(i = 0; i < *iLastItem; i++)
    {
        if(Vec_IntSize(iMatch[i]) == 1)
            continue;
        
        array = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );
        sortedArray = Vec_IntAlloc( Vec_IntSize(iMatch[i]) );

        for(j = 0; j < Vec_IntSize(iMatch[i]); j++)
        {        
            int factor, encode;

            encode = 0;
            factor = 1;    
            
            for(k = 0; k < Vec_IntSize(iDep[Vec_IntEntry(iMatch[i], j)]); k++)                            
                encode += oGroup[Vec_IntEntry(iDep[Vec_IntEntry(iMatch[i], j)], k)] * factor;                        

            Vec_IntPush(array, encode);
            Vec_IntPushUniqueOrder(sortedArray, encode);
            
            //printf("%d ", Vec_IntEntry(array, j));
        }            
                
        while( Vec_IntSize(sortedArray) > 1 )
        {            
            for(k = 0; k < Vec_IntSize(iMatch[i]); k++) 
            {
                if(Vec_IntEntry(array, k) == Vec_IntEntryLast(sortedArray))
                {
                    Vec_IntPush(iMatch[*iLastItem+numOfItemsAdded], Vec_IntEntry(iMatch[i], k));
                    iGroup[Vec_IntEntry(iMatch[i], k)] = *iLastItem+numOfItemsAdded;
                    Vec_IntRemove( iMatch[i], Vec_IntEntry(iMatch[i], k) );                            
                    Vec_IntRemove( array, Vec_IntEntry(array, k) );    
                    k--;
                }
            }
            numOfItemsAdded++;
            Vec_IntPop(sortedArray);    
        }

        Vec_IntFree( array );        
        Vec_IntFree( sortedArray );    
        //printf("\n");
    }    

    *iLastItem += numOfItemsAdded;

    /*printf("\n");
    for(j = 0; j < *iLastItem ; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }*/

    return numOfItemsAdded;    
}